

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_sat(DisasContext_conflict1 *s,arg_sat *a,
            _func_void_TCGContext_ptr_TCGv_i32_TCGv_env_TCGv_i32_TCGv_i32_conflict *gen)

{
  int arg2;
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar2;
  int32_t arg2_00;
  uintptr_t o;
  
  uVar1 = s->features;
  if ((uVar1 & 8) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    arg2 = a->imm;
    ret = load_reg(s,a->rn);
    if (a->sh == 0) {
      tcg_gen_shli_i32_aarch64(tcg_ctx,ret,ret,arg2);
    }
    else {
      arg2_00 = 0x1f;
      if (arg2 != 0) {
        arg2_00 = arg2;
      }
      tcg_gen_sari_i32_aarch64(tcg_ctx,ret,ret,arg2_00);
    }
    pTVar2 = tcg_const_i32_aarch64(tcg_ctx,a->satimm);
    (*gen)(tcg_ctx,ret,tcg_ctx->cpu_env,ret,pTVar2);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    store_reg(s,a->rd,ret);
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool op_sat(DisasContext *s, arg_sat *a,
                   void (*gen)(TCGContext *, TCGv_i32, TCGv_env, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp, satimm;
    int shift = a->imm;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    tmp = load_reg(s, a->rn);
    if (a->sh) {
        tcg_gen_sari_i32(tcg_ctx, tmp, tmp, shift ? shift : 31);
    } else {
        tcg_gen_shli_i32(tcg_ctx, tmp, tmp, shift);
    }

    satimm = tcg_const_i32(tcg_ctx, a->satimm);
    gen(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp, satimm);
    tcg_temp_free_i32(tcg_ctx, satimm);

    store_reg(s, a->rd, tmp);
    return true;
}